

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void gen_h4grams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  uint uVar1;
  ulong in_RAX;
  uint uVar2;
  ulong uVar3;
  undefined8 uStack_38;
  
  if (3 < size) {
    uVar3 = 0;
    uVar1 = 0;
    uStack_38 = in_RAX;
    do {
      uVar2 = (uint)mem[uVar3] | uVar1 << 8;
      if (2 < uVar3) {
        uStack_38 = CONCAT44(uVar1 ^ uVar2,(undefined4)uStack_38) & 0xffffffffffffff;
        if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*cb->_M_invoker)((_Any_data *)cb,(uint *)((long)&uStack_38 + 4));
      }
      uVar3 = uVar3 + 1;
      uVar1 = uVar2;
    } while (size != uVar3);
  }
  return;
}

Assistant:

void gen_h4grams(const uint8_t *mem, uint64_t size, const TrigramCallback &cb) {
    if (size < 4) {
        return;
    }

    uint32_t gram4 = 0;

    for (uint64_t offset = 0; offset < size; offset++) {
        gram4 = ((gram4 & 0xFFFFFFU) << 8U) | mem[offset];

        if (offset >= 3) {
            cb(((gram4 >> 8U) & 0xFFFFFFU) ^ (gram4 & 0xFFFFFFU));
        }
    }
}